

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumBlock
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  ErrorMaker local_60;
  string_view local_50;
  string_view local_40;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *enum_location_local;
  EnumDescriptorProto *enum_type_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)enum_location;
  enum_location_local = (LocationRecorder *)enum_type;
  enum_type_local = (EnumDescriptorProto *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"{");
  bVar1 = ConsumeEndOfDeclaration(this,local_40,(LocationRecorder *)containing_file_local);
  if (bVar1) {
    while( true ) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"}");
      bVar1 = TryConsumeEndOfDeclaration(this,local_50,(LocationRecorder *)0x0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      bVar1 = AtEnd(this);
      if (bVar1) {
        ErrorMaker::ErrorMaker(&local_60,"Reached end of input in enum definition (missing \'}\').")
        ;
        RecordError(this,local_60);
        return false;
      }
      bVar1 = ParseEnumStatement(this,(EnumDescriptorProto *)enum_location_local,
                                 (LocationRecorder *)containing_file_local,local_30);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseEnumBlock(EnumDescriptorProto* enum_type,
                            const LocationRecorder& enum_location,
                            const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &enum_location));

  while (!TryConsumeEndOfDeclaration("}", nullptr)) {
    if (AtEnd()) {
      RecordError("Reached end of input in enum definition (missing '}').");
      return false;
    }

    if (!ParseEnumStatement(enum_type, enum_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}